

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlXPathObjectPtr pxVar8;
  ulong uVar9;
  xmlXPathCompExprPtr pxVar10;
  bool bVar11;
  byte *pbVar12;
  long lVar13;
  xmlChar xVar14;
  byte *pbVar15;
  bool bVar16;
  double dVar17;
  void *pvVar18;
  undefined8 local_48;
  void *local_40;
  double local_38;
  
  pbVar12 = ctxt->cur;
  pbVar5 = pbVar12;
  while( true ) {
    pbVar15 = pbVar5 + 1;
    bVar1 = *pbVar5;
    uVar9 = (ulong)bVar1;
    if (0x28 < uVar9) break;
    if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
      if ((0x11000000000U >> (uVar9 & 0x3f) & 1) != 0) goto switchD_001d5ab8_caseD_27;
      break;
    }
    ctxt->cur = pbVar15;
    pbVar12 = (byte *)(ulong)((int)pbVar12 + 1);
    pbVar5 = pbVar15;
  }
  if ((byte)(bVar1 - 0x30) < 10) goto switchD_001d5ab8_caseD_27;
  switch(bVar1) {
  case 0x27:
    break;
  case 0x28:
  case 0x29:
  case 0x2b:
  case 0x2c:
  case 0x2d:
switchD_001d5ab8_caseD_28:
    while (((byte)uVar9 < 0x21 && ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0))) {
      ctxt->cur = pbVar15;
      bVar1 = *pbVar15;
      pbVar12 = (byte *)(ulong)((int)pbVar12 + 1);
      pbVar15 = pbVar15 + 1;
      uVar9 = (ulong)bVar1;
    }
    uVar2 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
    if ((uVar2 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
LAB_001d5ef5:
      xmlXPathErr(ctxt,7);
      return;
    }
    if (uVar2 < 0x100) {
      if ((0x16 < uVar2 - 0xc0 && 0x19 < (uVar2 & 0xdf) - 0x41) &&
         (((uVar2 < 0xf8 && 0x1e < uVar2 - 0xd8 && ((char)uVar2 != '_')) && ((uVar2 & 0xff) != 0x3a)
          ))) goto LAB_001d5ef5;
    }
    else {
      iVar4 = xmlCharInRange(uVar2,&xmlIsBaseCharGroup);
      if ((iVar4 == 0) && ((8 < uVar2 - 0x3021 && 0x51a5 < uVar2 - 0x4e00) && uVar2 != 0x3007))
      goto LAB_001d5ef5;
    }
    while ((0x3e < uVar2 || ((0x4000800100000000U >> ((ulong)uVar2 & 0x3f) & 1) == 0))) {
      if (uVar2 < 0x100) {
        if ((0x16 < uVar2 - 0xc0 && 0x19 < (uVar2 & 0xdf) - 0x41) &&
           ((9 < uVar2 - 0x30 && 0x1e < uVar2 - 0xd8) && uVar2 < 0xf8)) {
LAB_001d6327:
          if ((0x32 < uVar2 - 0x2d) ||
             ((0x4000000002003U >> ((ulong)(uVar2 - 0x2d) & 0x3f) & 1) == 0)) {
            if (uVar2 < 0x100) {
              uVar2 = (uint)(uVar2 == 0xb7);
            }
            else {
              iVar4 = xmlCharInRange(uVar2,&xmlIsCombiningGroup);
              if (iVar4 != 0) goto LAB_001d6340;
              uVar2 = xmlCharInRange(uVar2,&xmlIsExtenderGroup);
            }
            if (uVar2 == 0) break;
          }
        }
      }
      else {
        iVar4 = xmlCharInRange(uVar2,&xmlIsBaseCharGroup);
        if (((iVar4 == 0) && ((8 < uVar2 - 0x3021 && 0x51a5 < uVar2 - 0x4e00) && uVar2 != 0x3007))
           && (iVar4 = xmlCharInRange(uVar2,&xmlIsDigitGroup), iVar4 == 0)) goto LAB_001d6327;
      }
LAB_001d6340:
      ctxt->cur = ctxt->cur + (int)local_48;
      uVar2 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
    }
    pxVar6 = xmlStrndup(pbVar15 + -1,*(int *)&ctxt->cur - (int)pbVar12);
    ctxt->cur = pbVar15 + -1;
    if (pxVar6 == (xmlChar *)0x0) goto LAB_001d5ef5;
    pxVar7 = xmlStrstr(pxVar6,(xmlChar *)"::");
    if (pxVar7 == (xmlChar *)0x0) {
      iVar4 = xmlStrlen(pxVar6);
      lVar13 = (long)iVar4;
      do {
        xVar14 = ctxt->cur[lVar13];
        if (xVar14 != ' ') {
          bVar16 = false;
          if ((xVar14 == '\0') || (bVar16 = false, xVar14 == '/')) goto LAB_001d646b;
          if ((1 < (byte)(xVar14 - 9)) && (xVar14 != '\r')) goto LAB_001d644c;
        }
        lVar13 = lVar13 + 1;
      } while( true );
    }
    (*xmlFree)(pxVar6);
    pbVar5 = ctxt->cur;
    goto LAB_001d5ac9;
  case 0x2a:
  case 0x2f:
switchD_001d5ab8_caseD_2a:
    xmlXPathCompExprAdd(ctxt,-1,-1,bVar1 == 0x2f ^ XPATH_OP_NODE,0,0,0,(void *)0x0,(void *)0x0);
    pbVar12 = ctxt->cur;
    while( true ) {
      uVar9 = (ulong)*pbVar12;
      if (0x2f < uVar9) break;
      if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
        if (uVar9 == 0x2f) goto LAB_001d5be0;
        break;
      }
      ctxt->cur = pbVar12 + 1;
      pbVar12 = pbVar12 + 1;
    }
    goto LAB_001d5e9a;
  case 0x2e:
    if (9 < (byte)(*pbVar15 - 0x30)) goto LAB_001d5ac9;
    break;
  default:
    if (bVar1 == 0x40) goto switchD_001d5ab8_caseD_2a;
    if (bVar1 != 0x22) goto switchD_001d5ab8_caseD_28;
  }
switchD_001d5ab8_caseD_27:
  pbVar5 = pbVar5 + 1;
  pbVar12 = pbVar5;
  while( true ) {
    bVar1 = pbVar12[-1];
    uVar9 = (ulong)bVar1;
    if (0x28 < uVar9) break;
    if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
      if (uVar9 == 0x24) {
        ctxt->cur = pbVar12;
        pxVar6 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
        if (pxVar6 != (xmlChar *)0x0) {
          ctxt->comp->last = -1;
          iVar4 = xmlXPathCompExprAdd(ctxt,-1,-1,XPATH_OP_VARIABLE,0,0,0,pxVar6,
                                      (void *)CONCAT44(local_48._4_4_,(int)local_48));
          if (iVar4 == -1) {
            (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
            (*xmlFree)(pxVar6);
          }
          pbVar12 = ctxt->cur;
          while( true ) {
            if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))
            break;
            ctxt->cur = pbVar12 + 1;
            pbVar12 = pbVar12 + 1;
          }
          if ((ctxt->context != (xmlXPathContextPtr)0x0) && ((ctxt->context->flags & 2) != 0)) {
            iVar4 = 0x18;
            goto LAB_001d601a;
          }
          goto LAB_001d6023;
        }
        (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
        iVar4 = 4;
        goto LAB_001d601a;
      }
      if (uVar9 == 0x28) goto LAB_001d5974;
      break;
    }
    ctxt->cur = pbVar12;
    pbVar12 = pbVar12 + 1;
    pbVar5 = pbVar5 + 1;
  }
  if ((byte)(bVar1 - 0x30) < 10) {
LAB_001d5997:
    if (ctxt->error == 0) {
      if (bVar1 != 0x2e && bVar1 < 0x30) goto LAB_001d59b5;
      pvVar18 = (void *)0x0;
      bVar11 = true;
      bVar16 = false;
      while( true ) {
        uVar2 = (uint)uVar9;
        if (9 < (byte)((char)uVar9 - 0x30U)) break;
        ctxt->cur = pbVar12;
        pvVar18 = (void *)((double)pvVar18 * 10.0 + (double)(uVar2 & 0xffffff0f));
        uVar9 = (ulong)*pbVar12;
        pbVar12 = pbVar12 + 1;
        bVar16 = true;
        bVar11 = false;
      }
      if ((char)uVar9 == '.') {
        ctxt->cur = pbVar12;
        bVar1 = *pbVar12;
        if (bVar1 < 0x30) {
          if (!bVar11) {
LAB_001d6073:
            uVar9 = 0;
            while (bVar1 == 0x30) {
              lVar13 = uVar9 + 1;
              ctxt->cur = pbVar12 + lVar13;
              uVar9 = uVar9 + 1;
              bVar1 = pbVar12[lVar13];
            }
            pbVar12 = pbVar12 + uVar9;
            iVar4 = (int)uVar9;
            local_38 = 0.0;
            while( true ) {
              pbVar12 = pbVar12 + 1;
              uVar2 = (uint)uVar9;
              if ((9 < (byte)(bVar1 - 0x30)) || (iVar4 + 0x14U <= uVar2)) break;
              local_38 = local_38 * 10.0 + (double)(int)(bVar1 - 0x30);
              uVar9 = (ulong)(uVar2 + 1);
              ctxt->cur = pbVar12;
              bVar1 = *pbVar12;
            }
            local_40 = pvVar18;
            dVar17 = pow(10.0,(double)(int)uVar2);
            pbVar12 = ctxt->cur;
            while (uVar2 = (uint)*pbVar12, (byte)(*pbVar12 - 0x30) < 10) {
              pbVar12 = pbVar12 + 1;
              ctxt->cur = pbVar12;
            }
            pvVar18 = (void *)((double)local_40 + local_38 / dVar17);
            goto LAB_001d6109;
          }
        }
        else if (bVar16 || bVar1 < 0x3a) goto LAB_001d6073;
LAB_001d59b5:
        iVar4 = 1;
        goto LAB_001d601a;
      }
      pbVar12 = pbVar12 + -1;
LAB_001d6109:
      if ((uVar2 | 0x20) == 0x65) {
        pbVar5 = pbVar12 + 1;
        ctxt->cur = pbVar5;
        bVar1 = pbVar12[1];
        if ((bVar1 != 0x2d) && (iVar4 = 0, bVar1 != 0x2b)) goto LAB_001d6494;
        pbVar5 = pbVar12 + 2;
        iVar4 = 0;
        while( true ) {
          ctxt->cur = pbVar5;
LAB_001d6494:
          if (9 < (byte)(*pbVar5 - 0x30)) break;
          if (iVar4 < 1000000) {
            iVar4 = iVar4 * 10 + -0x30 + (uint)*pbVar5;
          }
          pbVar5 = pbVar5 + 1;
        }
        iVar3 = -iVar4;
        if (bVar1 != 0x2d) {
          iVar3 = iVar4;
        }
        local_40 = pvVar18;
        dVar17 = pow(10.0,(double)iVar3);
        pvVar18 = (void *)((double)local_40 * dVar17);
      }
      pxVar8 = xmlXPathCacheNewFloat(ctxt->context,(double)pvVar18);
      if (pxVar8 == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar4 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,3,0,0,pxVar8,(void *)0x0
                                   );
        if (iVar4 == -1) {
          xmlXPathReleaseObject(ctxt->context,pxVar8);
        }
      }
    }
  }
  else {
    pbVar15 = pbVar12;
    if (bVar1 == 0x22) {
      while( true ) {
        ctxt->cur = pbVar15;
        do {
          uVar2 = (uint)*pbVar15;
          if (*pbVar15 < 0x20) {
            if ((0xd < uVar2) || ((0x2600U >> (uVar2 & 0x1f) & 1) == 0)) goto LAB_001d6445;
            goto LAB_001d5d8f;
          }
        } while (uVar2 == 0);
        if (uVar2 == 0x22) break;
LAB_001d5d8f:
        pbVar15 = pbVar15 + 1;
      }
    }
    else {
      if (bVar1 != 0x27) {
        if ((bVar1 != 0x2e) || (9 < (byte)(*pbVar12 - 0x30))) {
          pxVar6 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
          if (pxVar6 == (xmlChar *)0x0) {
            (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
          }
          else {
            uVar2 = 1;
            iVar4 = -1;
            pbVar12 = ctxt->cur;
            while( true ) {
              pbVar5 = pbVar12 + 1;
              uVar9 = (ulong)*pbVar12;
              if (0x28 < uVar9) break;
              if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
                if (uVar9 == 0x28) goto LAB_001d5f18;
                break;
              }
              ctxt->cur = pbVar5;
              pbVar12 = pbVar5;
            }
            (*xmlFree)(pxVar6);
            pvVar18 = (void *)CONCAT44(local_48._4_4_,(int)local_48);
LAB_001d6015:
            (*xmlFree)(pvVar18);
          }
          iVar4 = 7;
          goto LAB_001d601a;
        }
        goto LAB_001d5997;
      }
      while( true ) {
        ctxt->cur = pbVar15;
        do {
          uVar2 = (uint)*pbVar15;
          if (*pbVar15 < 0x20) {
            if ((0xd < uVar2) || ((0x2600U >> (uVar2 & 0x1f) & 1) == 0)) goto LAB_001d6445;
            goto LAB_001d5d5a;
          }
        } while (uVar2 == 0);
        if (uVar2 == 0x27) break;
LAB_001d5d5a:
        pbVar15 = pbVar15 + 1;
      }
    }
    pxVar6 = xmlStrndup(pbVar12,(int)pbVar15 - (int)pbVar5);
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    if (pxVar6 != (xmlChar *)0x0) {
      pxVar8 = xmlXPathCacheNewString(ctxt->context,pxVar6);
      if (pxVar8 == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar4 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,4,0,0,pxVar8,(void *)0x0
                                   );
        if (iVar4 == -1) {
          xmlXPathReleaseObject(ctxt->context,pxVar8);
        }
      }
      (*xmlFree)(pxVar6);
    }
  }
  goto LAB_001d6023;
LAB_001d644c:
  if (xVar14 == '(') {
    iVar4 = xmlXPathIsNodeType(pxVar6);
    bVar16 = iVar4 == 0;
    xVar14 = ctxt->cur[lVar13];
  }
  else {
    bVar16 = false;
  }
LAB_001d646b:
  (*xmlFree)(pxVar6);
  pbVar5 = ctxt->cur;
  if ((xVar14 == '\0') || (!bVar16)) {
LAB_001d5ac9:
    bVar1 = *pbVar5;
    goto switchD_001d5ab8_caseD_2a;
  }
  goto switchD_001d5ab8_caseD_27;
LAB_001d5be0:
  do {
    pbVar12 = ctxt->cur;
    if (*pbVar12 != 0x2f) break;
    if (pbVar12[1] == 0x2f) {
      pbVar12 = pbVar12 + 2;
      while( true ) {
        ctxt->cur = pbVar12;
        if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))
        break;
        pbVar12 = pbVar12 + 1;
      }
      xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0);
LAB_001d5c73:
      xmlXPathCompRelativeLocationPath(ctxt);
    }
    else {
      do {
        pbVar12 = pbVar12 + 1;
        ctxt->cur = pbVar12;
        bVar1 = *pbVar12;
        uVar9 = (ulong)bVar1;
        if (0x20 < uVar9) goto LAB_001d5c27;
      } while ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0);
      if (uVar9 != 0) {
LAB_001d5c27:
        if (((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) ||
           ((bVar1 - 0x2a < 0x36 && ((0x20000000400011U >> ((ulong)(bVar1 - 0x2a) & 0x3f) & 1) != 0)
            ))) goto LAB_001d5c73;
      }
    }
  } while (ctxt->error == 0);
  goto LAB_001d5ea2;
LAB_001d5974:
  while( true ) {
    ctxt->cur = pbVar12;
    if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)) break;
    pbVar12 = pbVar12 + 1;
  }
  xmlXPathCompileExpr(ctxt,1);
  if (ctxt->error == 0) {
    pbVar12 = ctxt->cur;
    if (*pbVar12 == 0x29) {
      do {
        pbVar12 = pbVar12 + 1;
        ctxt->cur = pbVar12;
        if (0x20 < (ulong)*pbVar12) break;
      } while ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0);
      goto LAB_001d6023;
    }
    xmlXPathErr(ctxt,7);
  }
  goto LAB_001d5c95;
LAB_001d6445:
  iVar4 = 2;
LAB_001d601a:
  xmlXPathErr(ctxt,iVar4);
  goto LAB_001d6023;
LAB_001d5f18:
  while( true ) {
    ctxt->cur = pbVar5;
    if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) break;
    pbVar5 = pbVar5 + 1;
  }
  local_40 = (void *)CONCAT44(local_48._4_4_,(int)local_48);
  if ((local_40 == (void *)0x0) && (*pxVar6 == 'c')) {
    iVar3 = xmlStrEqual(pxVar6,(xmlChar *)"count");
    uVar2 = (uint)(iVar3 == 0);
    pbVar5 = ctxt->cur;
  }
  pxVar10 = ctxt->comp;
  pxVar10->last = -1;
  uVar9 = (ulong)*pbVar5;
  iVar3 = 0;
  if (*pbVar5 != 0x29) {
    iVar3 = 0;
    while ((char)uVar9 != '\0') {
      iVar4 = pxVar10->last;
      pxVar10->last = -1;
      xmlXPathCompileExpr(ctxt,uVar2);
      if (ctxt->error != 0) {
        (*xmlFree)(pxVar6);
        (*xmlFree)(local_40);
        goto LAB_001d6023;
      }
      xmlXPathCompExprAdd(ctxt,iVar4,ctxt->comp->last,XPATH_OP_ARG,0,0,0,(void *)0x0,(void *)0x0);
      iVar3 = iVar3 + 1;
      pbVar12 = ctxt->cur;
      if (*pbVar12 != 0x2c) {
        if (*pbVar12 != 0x29) {
          (*xmlFree)(pxVar6);
          pvVar18 = local_40;
          goto LAB_001d6015;
        }
        pxVar10 = ctxt->comp;
        break;
      }
      do {
        pbVar12 = pbVar12 + 1;
        ctxt->cur = pbVar12;
        uVar9 = (ulong)*pbVar12;
        if (0x20 < uVar9) break;
      } while ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0);
      pxVar10 = ctxt->comp;
    }
    iVar4 = pxVar10->last;
  }
  pvVar18 = local_40;
  iVar4 = xmlXPathCompExprAdd(ctxt,iVar4,-1,XPATH_OP_FUNCTION,iVar3,0,0,pxVar6,local_40);
  if (iVar4 == -1) {
    (*xmlFree)(pvVar18);
    (*xmlFree)(pxVar6);
  }
  pbVar12 = ctxt->cur;
  if (*pbVar12 != 0) goto LAB_001d6548;
  while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))) {
LAB_001d6548:
    pbVar12 = pbVar12 + 1;
    ctxt->cur = pbVar12;
  }
LAB_001d6023:
  pbVar12 = ctxt->cur;
  while( true ) {
    if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar12 + 1;
    pbVar12 = pbVar12 + 1;
  }
LAB_001d5c95:
  if (ctxt->error == 0) {
    pbVar12 = ctxt->cur;
    while ((uVar9 = (ulong)*pbVar12, uVar9 < 0x21 && ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0))) {
      pbVar12 = pbVar12 + 1;
      ctxt->cur = pbVar12;
    }
    while ((char)uVar9 == '[') {
      xmlXPathCompPredicate(ctxt,1);
      pbVar12 = ctxt->cur;
      while ((uVar9 = (ulong)*pbVar12, uVar9 < 0x21 && ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0)))
      {
        pbVar12 = pbVar12 + 1;
        ctxt->cur = pbVar12;
      }
    }
    if (ctxt->error == 0) {
      if ((char)uVar9 == '/') {
        if (pbVar12[1] == 0x2f) {
          pbVar12 = pbVar12 + 2;
          while( true ) {
            ctxt->cur = pbVar12;
            if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))
            break;
            pbVar12 = pbVar12 + 1;
          }
          xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,
                              (void *)0x0);
        }
LAB_001d5e9a:
        xmlXPathCompRelativeLocationPath(ctxt);
      }
LAB_001d5ea2:
      pbVar12 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))
        break;
        ctxt->cur = pbVar12 + 1;
        pbVar12 = pbVar12 + 1;
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt) {
    int lc = 1;           /* Should we branch to LocationPath ?         */
    xmlChar *name = NULL; /* we may have to preparse a name to find out */

    SKIP_BLANKS;
    if ((CUR == '$') || (CUR == '(') ||
	(IS_ASCII_DIGIT(CUR)) ||
        (CUR == '\'') || (CUR == '"') ||
	(CUR == '.' && IS_ASCII_DIGIT(NXT(1)))) {
	lc = 0;
    } else if (CUR == '*') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '/') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '@') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else if (CUR == '.') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else {
	/*
	 * Problem is finding if we have a name here whether it's:
	 *   - a nodetype
	 *   - a function call in which case it's followed by '('
	 *   - an axis in which case it's followed by ':'
	 *   - a element name
	 * We do an a priori analysis here rather than having to
	 * maintain parsed token content through the recursive function
	 * calls. This looks uglier but makes the code easier to
	 * read/write/debug.
	 */
	SKIP_BLANKS;
	name = xmlXPathScanName(ctxt);
	if ((name != NULL) && (xmlStrstr(name, (xmlChar *) "::") != NULL)) {
#ifdef DEBUG_STEP
	    xmlGenericError(xmlGenericErrorContext,
		    "PathExpr: Axis\n");
#endif
	    lc = 1;
	    xmlFree(name);
	} else if (name != NULL) {
	    int len =xmlStrlen(name);


	    while (NXT(len) != 0) {
		if (NXT(len) == '/') {
		    /* element name */
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if (IS_BLANK_CH(NXT(len))) {
		    /* ignore blanks */
		    ;
		} else if (NXT(len) == ':') {
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if ((NXT(len) == '(')) {
		    /* Node Type or Function */
		    if (xmlXPathIsNodeType(name)) {
#ifdef DEBUG_STEP
		        xmlGenericError(xmlGenericErrorContext,
				"PathExpr: Type search\n");
#endif
			lc = 1;
#ifdef LIBXML_XPTR_LOCS_ENABLED
                    } else if (ctxt->xptr &&
                               xmlStrEqual(name, BAD_CAST "range-to")) {
                        lc = 1;
#endif
		    } else {
#ifdef DEBUG_STEP
		        xmlGenericError(xmlGenericErrorContext,
				"PathExpr: function call\n");
#endif
			lc = 0;
		    }
                    break;
		} else if ((NXT(len) == '[')) {
		    /* element name */
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if ((NXT(len) == '<') || (NXT(len) == '>') ||
			   (NXT(len) == '=')) {
		    lc = 1;
		    break;
		} else {
		    lc = 1;
		    break;
		}
		len++;
	    }
	    if (NXT(len) == 0) {
#ifdef DEBUG_STEP
		xmlGenericError(xmlGenericErrorContext,
			"PathExpr: AbbrRelLocation\n");
#endif
		/* element name */
		lc = 1;
	    }
	    xmlFree(name);
	} else {
	    /* make sure all cases are covered explicitly */
	    XP_ERROR(XPATH_EXPR_ERROR);
	}
    }

    if (lc) {
	if (CUR == '/') {
	    PUSH_LEAVE_EXPR(XPATH_OP_ROOT, 0, 0);
	} else {
	    PUSH_LEAVE_EXPR(XPATH_OP_NODE, 0, 0);
	}
	xmlXPathCompLocationPath(ctxt);
    } else {
	xmlXPathCompFilterExpr(ctxt);
	CHECK_ERROR;
	if ((CUR == '/') && (NXT(1) == '/')) {
	    SKIP(2);
	    SKIP_BLANKS;

	    PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_DESCENDANT_OR_SELF,
		    NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);

	    xmlXPathCompRelativeLocationPath(ctxt);
	} else if (CUR == '/') {
	    xmlXPathCompRelativeLocationPath(ctxt);
	}
    }
    SKIP_BLANKS;
}